

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O3

void gl4cts::KHRDebug::cleanMessageLog(Functions *gl)

{
  GLuint GVar1;
  GLenum err;
  
  do {
    GVar1 = (*gl->getDebugMessageLog)
                      (0x10,0,(GLenum *)0x0,(GLenum *)0x0,(GLuint *)0x0,(GLenum *)0x0,(GLsizei *)0x0
                       ,(GLchar *)0x0);
    err = (*gl->getError)();
    glu::checkError(err,"GetDebugMessageLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x6b);
  } while (GVar1 != 0);
  return;
}

Assistant:

void cleanMessageLog(const Functions* gl)
{
	static const GLuint count = 16;

	while (1)
	{
		GLuint ret = gl->getDebugMessageLog(count /* count */, 0 /* bufSize */, 0 /* sources */, 0 /* types */,
											0 /* ids */, 0 /* severities */, 0 /* lengths */, 0 /* messageLog */);

		GLU_EXPECT_NO_ERROR(gl->getError(), "GetDebugMessageLog");

		if (0 == ret)
		{
			break;
		}
	}
}